

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O1

void player_resting_set_count(player *p,int16_t count)

{
  if (player_rest_disturb) {
    p->upkeep->resting = L'\0';
    player_rest_disturb = false;
    return;
  }
  if (-5 < count) {
    if (0x270e < count) {
      count = 9999;
    }
    p->upkeep->resting = (int)count;
    return;
  }
  p->upkeep->resting = L'\0';
  return;
}

Assistant:

void player_resting_set_count(struct player *p, int16_t count)
{
	/* Cancel if player is disturbed */
	if (player_rest_disturb) {
		p->upkeep->resting = 0;
		player_rest_disturb = false;
		return;
	}

	/* Ignore if the rest count is negative. */
	if ((count < 0) && !player_resting_is_special(count)) {
		p->upkeep->resting = 0;
		return;
	}

	/* Save the rest code */
	p->upkeep->resting = count;

	/* Truncate overlarge values */
	if (p->upkeep->resting > 9999) p->upkeep->resting = 9999;
}